

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_cache_operation(DisasContext_conflict6 *ctx,uint32_t op,int base,int16_t offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i32 arg3;
  TCGv_i64 addr;
  TCGv_i64 t1;
  TCGv_i32 t0;
  TCGContext_conflict6 *tcg_ctx;
  int16_t offset_local;
  int base_local;
  uint32_t op_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg3 = tcg_const_i32_mips64el(tcg_ctx_00,op);
  addr = tcg_temp_new_i64(tcg_ctx_00);
  gen_base_offset_addr(ctx,addr,base,(int)offset);
  gen_helper_cache(tcg_ctx_00,tcg_ctx_00->cpu_env,addr,arg3);
  return;
}

Assistant:

static void gen_cache_operation(DisasContext *ctx, uint32_t op, int base,
                                int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, op);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    gen_base_offset_addr(ctx, t1, base, offset);
    gen_helper_cache(tcg_ctx, tcg_ctx->cpu_env, t1, t0);
}